

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGAttributeMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlAttrPtr prop)

{
  xmlRelaxNGDefinePtr pxVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlRelaxNGDefinePtr_conflict local_40;
  xmlRelaxNGDefinePtr_conflict list_1;
  xmlRelaxNGDefinePtr_conflict list;
  int ret;
  xmlAttrPtr prop_local;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if ((define->name != (xmlChar *)0x0) && (iVar3 = xmlStrEqual(define->name,prop->name), iVar3 == 0)
     ) {
    return 0;
  }
  if (define->ns != (xmlChar *)0x0) {
    if (*define->ns == '\0') {
      if (prop->ns != (xmlNs *)0x0) {
        return 0;
      }
    }
    else if ((prop->ns == (xmlNs *)0x0) ||
            (iVar3 = xmlStrEqual(define->ns,prop->ns->href), iVar3 == 0)) {
      return 0;
    }
  }
  if (define->nameClass != (xmlRelaxNGDefinePtr)0x0) {
    pxVar1 = define->nameClass;
    if (pxVar1->type == XML_RELAXNG_EXCEPT) {
      for (list_1 = pxVar1->content; list_1 != (xmlRelaxNGDefinePtr_conflict)0x0;
          list_1 = list_1->next) {
        iVar3 = xmlRelaxNGAttributeMatch(ctxt,list_1,prop);
        if (iVar3 == 1) {
          return 0;
        }
        if (iVar3 < 0) {
          return iVar3;
        }
      }
    }
    else {
      if (pxVar1->type == XML_RELAXNG_CHOICE) {
        local_40 = pxVar1->nameClass;
        while( true ) {
          if (local_40 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return 0;
          }
          iVar3 = xmlRelaxNGAttributeMatch(ctxt,local_40,prop);
          if (iVar3 == 1) break;
          if (iVar3 < 0) {
            return iVar3;
          }
          local_40 = local_40->next;
        }
        return 1;
      }
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                ,0x2392);
    }
  }
  return 1;
}

Assistant:

static int
xmlRelaxNGAttributeMatch(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGDefinePtr define, xmlAttrPtr prop)
{
    int ret;

    if (define->name != NULL) {
        if (!xmlStrEqual(define->name, prop->name))
            return (0);
    }
    if (define->ns != NULL) {
        if (define->ns[0] == 0) {
            if (prop->ns != NULL)
                return (0);
        } else {
            if ((prop->ns == NULL) ||
                (!xmlStrEqual(define->ns, prop->ns->href)))
                return (0);
        }
    }
    if (define->nameClass == NULL)
        return (1);
    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGAttributeMatch(ctxt, list, prop);
            if (ret == 1)
                return (0);
            if (ret < 0)
                return (ret);
            list = list->next;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGAttributeMatch(ctxt, list, prop);
            if (ret == 1)
                return (1);
            if (ret < 0)
                return (ret);
            list = list->next;
        }
        return (0);
    } else {
    TODO}
    return (1);
}